

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_6::VisitPrimsRec
               (Path *root_abs_path,Prim *root,int32_t level,VisitPrimFunction visitor_fun,
               void *userdata,string *err)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  PrimMeta *pPVar4;
  iterator iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Prim *root_00;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Prim *pPVar8;
  size_t i;
  ulong uVar9;
  allocator local_1b5;
  int local_1b4;
  Path *local_1b0;
  string *local_1a8;
  VisitPrimFunction local_1a0;
  void *local_198;
  string fun_error;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  token nameTok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Path child_abs_path;
  
  fun_error._M_dataplus._M_p = (pointer)&fun_error.field_2;
  fun_error._M_string_length = 0;
  fun_error.field_2._M_local_buf[0] = '\0';
  local_1b4 = level;
  local_1b0 = root_abs_path;
  local_1a0 = visitor_fun;
  local_198 = userdata;
  bVar2 = (*visitor_fun)(root_abs_path,root,level,userdata,&fun_error);
  if (bVar2) {
    pPVar4 = Prim::metas(root);
    root_00 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar8 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)(pPVar4->primChildren).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pPVar4->primChildren).
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 5 != ((long)pPVar8 - (long)root_00) / 0x350) {
      local_1b4 = local_1b4 + 1;
      do {
        bVar2 = root_00 == pPVar8;
        if (bVar2) break;
        Path::AppendPrim(&child_abs_path,local_1b0,&(root_00->_elementPath)._prim_part);
        bVar3 = VisitPrimsRec(&child_abs_path,root_00,local_1b4,local_1a0,local_198,err);
        Path::~Path(&child_abs_path);
        root_00 = root_00 + 1;
      } while (bVar3);
      goto LAB_00270ae0;
    }
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &primNameTable._M_t._M_impl.super__Rb_tree_header._M_header;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar6 = 0;
    local_1a8 = err;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar9 = 0; uVar9 < (ulong)(((long)pPVar8 - (long)root_00) / 0x350); uVar9 = uVar9 + 1) {
      child_abs_path._prim_part._M_dataplus._M_p =
           (pointer)((long)&(root_00->_abs_path)._prim_part._M_dataplus._M_p + lVar6);
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                  *)&primNameTable,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(root_00->_elementPath)._prim_part._M_dataplus._M_p + lVar6),
                 (Prim **)&child_abs_path);
      root_00 = (root->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar8 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = lVar6 + 0x350;
    }
    local_1b4 = local_1b4 + 1;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
    ;
    lVar6 = 0;
    do {
      pPVar4 = Prim::metas(root);
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)(pPVar4->primChildren).
                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pPVar4->primChildren).
                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5);
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(pbVar7->_M_dataplus)._M_p + 1);
      if (args <= pbVar7) {
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
        ::~_Rb_tree(&primNameTable._M_t);
        bVar2 = true;
        goto LAB_00270ae0;
      }
      pPVar4 = Prim::metas(root);
      ::std::__cxx11::string::string
                ((string *)&nameTok.str_,
                 (string *)
                 ((long)&(((pPVar4->primChildren).
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_start)->str_)._M_dataplus._M_p + lVar6
                 ));
      iVar5 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
              ::find(&primNameTable._M_t,&nameTok.str_);
      psVar1 = local_1a8;
      if ((_Rb_tree_header *)iVar5._M_node == &primNameTable._M_t._M_impl.super__Rb_tree_header) {
        if (local_1a8 != (string *)0x0) {
          ::std::__cxx11::string::string
                    ((string *)&local_120,
                     "Prim name `{}` in `primChildren` metadatum not found in this Prim\'s children"
                     ,&local_1b5);
          fmt::format<std::__cxx11::string>
                    ((string *)&child_abs_path,(fmt *)&local_120,(string *)&nameTok,args);
          ::std::__cxx11::string::append((string *)psVar1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::string::_M_dispose();
        break;
      }
      lVar6 = lVar6 + 0x20;
      Path::AppendPrim(&child_abs_path,local_1b0,&nameTok.str_);
      bVar2 = VisitPrimsRec(&child_abs_path,*(Prim **)(iVar5._M_node + 2),local_1b4,local_1a0,
                            local_198,local_1a8);
      Path::~Path(&child_abs_path);
      ::std::__cxx11::string::_M_dispose();
    } while (bVar2);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::~_Rb_tree(&primNameTable._M_t);
  }
  else {
    bVar2 = false;
    if ((err == (string *)0x0) || (fun_error._M_string_length == 0)) goto LAB_00270ae0;
    ::std::__cxx11::string::string
              ((string *)&primNameTable,
               "Visit function returned an error for Prim {} (id {}). err = {}",&local_1b5);
    Path::full_path_name_abi_cxx11_(&nameTok.str_,local_1b0);
    local_120._M_dataplus._M_p = (pointer)root->_prim_id;
    fmt::format<std::__cxx11::string,long,std::__cxx11::string>
              (&child_abs_path._prim_part,(fmt *)&primNameTable,&nameTok.str_,&local_120,
               (long *)&fun_error,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)userdata);
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  bVar2 = false;
LAB_00270ae0:
  ::std::__cxx11::string::_M_dispose();
  return bVar2;
}

Assistant:

bool VisitPrimsRec(const tinyusdz::Path &root_abs_path,
                   const tinyusdz::Prim &root, int32_t level,
                   VisitPrimFunction visitor_fun, void *userdata,
                   std::string *err) {
  std::string fun_error;
  bool ret = visitor_fun(root_abs_path, root, level, userdata, &fun_error);
  if (!ret) {
    if (fun_error.empty()) {
      // early termination request.
      DCOUT("Early termination requested");
    } else {
      if (err) {
        (*err) += fmt::format(
            "Visit function returned an error for Prim {} (id {}). err = {}",
            root_abs_path.full_path_name(), root.prim_id(), fun_error);
      }
    }
    return false;
  }

  // if `primChildren` is available, use it
  if (root.metas().primChildren.size() == root.children().size()) {
    std::map<std::string, const Prim *> primNameTable;
    for (size_t i = 0; i < root.children().size(); i++) {
      primNameTable.emplace(root.children()[i].element_name(),
                            &root.children()[i]);
    }

    for (size_t i = 0; i < root.metas().primChildren.size(); i++) {
      value::token nameTok = root.metas().primChildren[i];
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        const Path child_abs_path = root_abs_path.AppendPrim(nameTok.str());
        if (!VisitPrimsRec(child_abs_path, *it->second, level + 1, visitor_fun,
                           userdata, err)) {
          return false;
        }
      } else {
        if (err) {
          (*err) += fmt::format(
              "Prim name `{}` in `primChildren` metadatum not found in this "
              "Prim's children",
              nameTok.str());
        }
        return false;
      }
    }

  } else {
    for (const auto &child : root.children()) {
      const Path child_abs_path =
          root_abs_path.AppendPrim(child.element_name());
      if (!VisitPrimsRec(child_abs_path, child, level + 1, visitor_fun,
                         userdata, err)) {
        return false;
      }
    }
  }

  return true;
}